

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O2

void __thiscall
neueda::cdr::findInChildren
          (cdr *this,orderedItemMap *items,cdrKey_t *key,
          vector<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_> *found)

{
  value_type in_RAX;
  value_type pcVar1;
  _Rb_tree_node_base *p_Var2;
  pointer pcVar3;
  cdrItem *item;
  value_type local_38;
  
  local_38 = in_RAX;
  for (p_Var2 = (items->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(items->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    pcVar1 = (value_type)p_Var2[1]._M_parent;
    if (pcVar1->mKey == *key) {
      local_38 = pcVar1;
      if (pcVar1->mType == 4) {
        for (pcVar3 = (pcVar1->mArray).super__Vector_base<neueda::cdr,_std::allocator<neueda::cdr>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar3 != (pcVar1->mArray).super__Vector_base<neueda::cdr,_std::allocator<neueda::cdr>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pcVar3 = pcVar3 + 1) {
          findInChildren(this,&pcVar3->mOrdered,key,found);
          pcVar1 = (value_type)p_Var2[1]._M_parent;
        }
      }
      else {
        std::vector<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_>::push_back
                  (found,&local_38);
      }
    }
  }
  return;
}

Assistant:

void
cdr::findInChildren (const orderedItemMap* items,
                     const cdrKey_t& key,
                     vector<const cdrItem*>& found) const
{
    orderedItemMap::const_iterator it0 = items->begin ();
    for (; it0 != items->end (); ++it0)
    {
        if (it0->second->mKey != key)
            continue;
        const cdrItem* item = it0->second;
        if (it0->second->mType == CDR_ARRAY)
        {
            vector<cdr>::const_iterator it = item->mArray.begin ();
            for (; it != it0->second->mArray.end (); ++it)
                findInChildren (&it->mOrdered, key, found);
        }
        else
            found.push_back (item);
    }
}